

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O1

void __thiscall Image_ExrIO_Test::TestBody(Image_ExrIO_Test *this)

{
  PixelFormat format_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  expected;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Allocator AVar6;
  RGBColorSpace *actual;
  ulong uVar7;
  float fVar8;
  uint uVar9;
  float fVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  float *pfVar15;
  ColorEncodingHandle *encoding;
  Point2i PVar16;
  int iVar17;
  long *plVar18;
  byte bVar19;
  undefined1 auVar20 [16];
  aligned_storage_t<sizeof(float),_alignof(float)> aVar21;
  Float FVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_float> buf;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  AssertionResult gtest_ar__1;
  PixelFormat format;
  ImageChannelDesc rgbDesc;
  AssertionResult gtest_ar_;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  ImageMetadata metadata;
  ImageAndMetadata read;
  Image image;
  AssertHelper local_598;
  AssertHelper local_590;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_588;
  byte local_579;
  AssertHelper local_578;
  PixelFormat local_56c;
  ImageChannelDesc local_568;
  undefined1 local_538 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  undefined1 *local_518;
  size_t local_510;
  undefined1 local_508 [16];
  long *local_4f8 [2];
  long local_4e8 [2];
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  ulong local_4c8;
  ulong local_4c0;
  ulong local_4b8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_4b0;
  ImageMetadata local_490;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [32];
  long local_350 [2];
  long local_340 [13];
  polymorphic_allocator<unsigned_char> local_2d8;
  uchar *local_2d0;
  size_t local_2c8;
  size_t local_2c0;
  polymorphic_allocator<pbrt::Half> local_2b8;
  Half *local_2b0;
  size_t local_2a8;
  size_t local_2a0;
  polymorphic_allocator<float> local_298;
  float *local_290;
  size_t local_288;
  size_t local_280;
  ImageMetadata local_278;
  long local_178;
  ulong local_170;
  ColorEncodingHandle local_168;
  ColorEncodingHandle local_160;
  PixelFormat local_154 [3];
  Image local_148;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  GetFloatPixels(&local_4b0,(Point2i)0x3100000010,3);
  local_154[0] = U256;
  local_154[1] = Half;
  local_154[2] = 2;
  local_4d0 = local_370;
  local_4d8 = local_538 + 0x20;
  lVar11 = 0;
  do {
    format_00 = *(PixelFormat *)((long)local_154 + lVar11);
    local_390._0_8_ = local_380;
    local_56c = format_00;
    local_178 = lVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"R","");
    local_370._0_8_ = local_370 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"G","");
    local_350[0] = (long)local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"B","");
    local_160.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )pbrt::ColorEncodingHandle::Linear.bits;
    AVar6.memoryResource = pstd::pmr::new_delete_resource();
    encoding = &local_160;
    channels.n = 3;
    channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390;
    pbrt::Image::Image(&local_148,format_00,(Point2i)0x3100000010,channels,encoding,AVar6);
    lVar11 = -0x60;
    plVar18 = local_340;
    do {
      if (plVar18 != (long *)plVar18[-2]) {
        operator_delete((long *)plVar18[-2],*plVar18 + 1);
      }
      plVar18 = plVar18 + -4;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    local_390._0_4_ = U256;
    local_390._4_4_ = 0;
    local_390._8_4_ = 0x10;
    local_390._12_4_ = 0x31;
    buf.n = local_4b0.nStored;
    buf.ptr = local_4b0.ptr;
    pbrt::Image::CopyRectIn(&local_148,(Bounds2i *)local_390,buf);
    uVar7 = 0;
    lVar11 = 0;
    bVar3 = true;
    do {
      local_579 = bVar3;
      local_4b8 = uVar7 << 0x20;
      uVar13 = 0;
      bVar19 = true;
      local_170 = uVar7;
      do {
        local_4c8 = CONCAT71(local_4c8._1_7_,bVar19);
        PVar16.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_4b8 | uVar13);
        lVar11 = (long)(int)lVar11;
        lVar12 = lVar11 * 4;
        iVar17 = 0;
        local_4c0 = uVar13;
        do {
          pfVar15 = local_4b0.ptr;
          if (local_56c == Float) {
            aVar21 = (aligned_storage_t<sizeof(float),_alignof(float)>)
                     pbrt::Image::GetChannel(&local_148,PVar16,iVar17,(WrapMode2D)0x200000002);
            local_490.renderTimeSeconds.optionalValue = aVar21;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_390,"rgbPixels[offset]","image.GetChannel({x, y}, c)",
                       (float *)((long)pfVar15 + lVar12),(float *)&local_490);
            if (local_390[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_490);
              pcVar14 = "";
              if ((undefined8 *)CONCAT44(local_390._12_4_,local_390._8_4_) != (undefined8 *)0x0) {
                pcVar14 = *(char **)CONCAT44(local_390._12_4_,local_390._8_4_);
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_538,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x159,pcVar14);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_538,(Message *)&local_490);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_538);
              bVar19 = (byte)local_4c8;
              if (local_490.renderTimeSeconds != (optional<float>)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) && (local_490.renderTimeSeconds != (optional<float>)0x0)) {
                  (**(code **)(*(long *)local_490.renderTimeSeconds + 8))();
                }
                local_490.renderTimeSeconds.optionalValue =
                     (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
                local_490.renderTimeSeconds.set = false;
                local_490.renderTimeSeconds._5_3_ = 0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_390 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              goto LAB_002cd764;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_390 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else if (local_56c == Half) {
            auVar20._8_4_ = 0x7fffffff;
            auVar20._0_8_ = 0x7fffffff7fffffff;
            auVar20._12_4_ = 0x7fffffff;
            auVar20 = vpandd_avx512vl(ZEXT416((uint)local_4b0.ptr[lVar11]),auVar20);
            fVar8 = auVar20._0_4_;
            if ((uint)fVar8 < 0x47800000) {
              if ((uint)fVar8 < 0x38800000) {
                fVar8 = fVar8 + 0.5;
              }
              else {
                fVar8 = (float)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >>
                               0xd);
              }
            }
            else {
              fVar8 = (float)((0x7f800000 < (uint)fVar8 | 0x3e) << 9);
            }
            iVar4 = vmovmskps_avx(ZEXT416((uint)local_4b0.ptr[lVar11]));
            uVar5 = (uint)(iVar4 << 0x1f) >> 0x10;
            uVar9 = (uVar5 | (uint)fVar8 & 0xffff) << 0xd;
            if (((uint)fVar8 & 0x7c00) == 0x7c00) {
              fVar10 = (float)(uVar9 | 0x70000000);
            }
            else if (((uint)fVar8 & 0x7c00) == 0) {
              fVar10 = (float)(uVar9 | 0x38800000) + -6.1035156e-05;
            }
            else {
              fVar10 = (float)(((uint)fVar8 & 0x7fff) * 0x2000 + 0x38000000);
            }
            local_490.renderTimeSeconds.optionalValue =
                 (aligned_storage_t<sizeof(float),_alignof(float)>)
                 ((uVar5 | (uint)fVar8 & 0x8000) << 0x10 | (uint)fVar10);
            FVar22 = pbrt::Image::GetChannel(&local_148,PVar16,iVar17,(WrapMode2D)0x200000002);
            local_538._0_4_ = FVar22;
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)local_390,"Float(Half(rgbPixels[offset]))",
                       "image.GetChannel({x, y}, c)",(float *)&local_490,(float *)local_538);
            if (local_390[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_490);
              pcVar14 = "";
              if ((undefined8 *)CONCAT44(local_390._12_4_,local_390._8_4_) != (undefined8 *)0x0) {
                pcVar14 = *(char **)CONCAT44(local_390._12_4_,local_390._8_4_);
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_538,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x157,pcVar14);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_538,(Message *)&local_490);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_538);
              bVar19 = (byte)local_4c8;
              if (local_490.renderTimeSeconds != (optional<float>)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) && (local_490.renderTimeSeconds != (optional<float>)0x0)) {
                  (**(code **)(*(long *)local_490.renderTimeSeconds + 8))();
                }
                local_490.renderTimeSeconds.optionalValue =
                     (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
                local_490.renderTimeSeconds.set = false;
                local_490.renderTimeSeconds._5_3_ = 0;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_390 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              goto LAB_002cd764;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_390 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          iVar17 = iVar17 + 1;
          lVar11 = lVar11 + 1;
          lVar12 = lVar12 + 4;
        } while (iVar17 != 3);
        bVar19 = local_4c0 < 0xf;
        uVar13 = local_4c0 + 1;
      } while (uVar13 != 0x10);
LAB_002cd764:
      if ((bVar19 & 1) != 0) {
        if ((local_579 & 1) != 0) {
          local_148.p32.nStored = 0;
          (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
                    (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,
                     4);
          local_148.p16.nStored = 0;
          (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
                    (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2
                    );
          local_148.p8.nStored = 0;
          (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
                    (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
          goto LAB_002cea2c;
        }
        break;
      }
      uVar7 = local_170 + 1;
      bVar3 = local_170 < 0x30;
    } while (uVar7 != 0x31);
    local_490.renderTimeSeconds.set = false;
    local_490.cameraFromWorld.set = false;
    local_490.NDCFromWorld.set = false;
    local_490.pixelBounds.set = false;
    local_490.fullResolution.set = false;
    local_490.samplesPerPixel.set = false;
    local_490.MSE.set = false;
    local_490.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_490.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_490.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_490.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
    local_490.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_490.colorSpace.optionalValue = pbrt::RGBColorSpace::ACES2065_1;
    local_490.colorSpace.set = true;
    local_390._0_8_ = local_380;
    local_490.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_490.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"test.exr","");
    bVar3 = pbrt::Image::Write(&local_148,(string *)local_390,&local_490);
    local_538[0] = (internal)bVar3;
    local_538._8_8_ = (float *)0x0;
    if ((undefined1 *)local_390._0_8_ != local_380) {
      operator_delete((void *)local_390._0_8_,local_380._0_8_ + 1);
    }
    if (local_538[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_568);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_390,(internal *)local_538,
                 (AssertionResult *)"image.Write(\"test.exr\", metadata)","false","true",
                 (char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                (&local_590,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x15e,(char *)local_390._0_8_);
      testing::internal::AssertHelper::operator=(&local_590,(Message *)&local_568);
      testing::internal::AssertHelper::~AssertHelper(&local_590);
      if ((undefined1 *)local_390._0_8_ != local_380) {
        operator_delete((void *)local_390._0_8_,local_380._0_8_ + 1);
      }
      if ((Tuple2<pbrt::Point2,_int>)local_568.offset.alloc.memoryResource !=
          (Tuple2<pbrt::Point2,_int>)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           ((Tuple2<pbrt::Point2,_int>)local_568.offset.alloc.memoryResource !=
            (Tuple2<pbrt::Point2,_int>)0x0)) {
          (**(code **)(*(long *)local_568.offset.alloc.memoryResource + 8))();
        }
        local_568.offset.alloc.memoryResource = (memory_resource *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_538 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_538._0_8_ = local_538 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_538,"test.exr","");
    AVar6.memoryResource = pstd::pmr::new_delete_resource();
    local_168.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    pbrt::Image::Read((ImageAndMetadata *)local_390,(string *)local_538,AVar6,&local_168);
    pcVar14 = (char *)local_390._0_8_;
    if ((AssertHelperData *)local_538._0_8_ != (AssertHelperData *)(local_538 + 0x10)) {
      operator_delete((void *)local_538._0_8_,local_528._M_allocated_capacity + 1);
      pcVar14 = (char *)local_390._0_8_;
    }
    local_390._4_4_ = (undefined4)((ulong)pcVar14 >> 0x20);
    local_568.offset.alloc.memoryResource =
         (memory_resource *)local_148.resolution.super_Tuple2<pbrt::Point2,_int>;
    local_590.data_ = (AssertHelperData *)CONCAT44(local_390._8_4_,local_390._4_4_);
    local_390._0_8_ = pcVar14;
    testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
              ((internal *)local_538,"image.Resolution()","read.image.Resolution()",
               (Point2<int> *)&local_568,(Point2<int> *)&local_590);
    if (local_538[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_568);
      pcVar14 = "";
      if ((float *)local_538._8_8_ != (float *)0x0) {
        pcVar14 = *(char **)local_538._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_590,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x162,pcVar14);
      testing::internal::AssertHelper::operator=(&local_590,(Message *)&local_568);
      testing::internal::AssertHelper::~AssertHelper(&local_590);
      if ((Tuple2<pbrt::Point2,_int>)local_568.offset.alloc.memoryResource !=
          (Tuple2<pbrt::Point2,_int>)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           ((Tuple2<pbrt::Point2,_int>)local_568.offset.alloc.memoryResource !=
            (Tuple2<pbrt::Point2,_int>)0x0)) {
          (**(code **)(*(long *)local_568.offset.alloc.memoryResource + 8))();
        }
        local_568.offset.alloc.memoryResource = (memory_resource *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_538 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    expected = pbrt::RGBColorSpace::ACES2065_1;
    actual = pbrt::ImageMetadata::GetColorSpace(&local_278);
    testing::internal::CmpHelperEQ<pbrt::RGBColorSpace,pbrt::RGBColorSpace>
              ((internal *)local_538,"*RGBColorSpace::ACES2065_1","*read.metadata.GetColorSpace()",
               (RGBColorSpace *)expected,actual);
    if (local_538[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_568);
      pcVar14 = "";
      if ((float *)local_538._8_8_ != (float *)0x0) {
        pcVar14 = *(char **)local_538._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_590,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x163,pcVar14);
      testing::internal::AssertHelper::operator=(&local_590,(Message *)&local_568);
      testing::internal::AssertHelper::~AssertHelper(&local_590);
      if ((Tuple2<pbrt::Point2,_int>)local_568.offset.alloc.memoryResource !=
          (Tuple2<pbrt::Point2,_int>)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) &&
           ((Tuple2<pbrt::Point2,_int>)local_568.offset.alloc.memoryResource !=
            (Tuple2<pbrt::Point2,_int>)0x0)) {
          (**(code **)(*(long *)local_568.offset.alloc.memoryResource + 8))();
        }
        local_568.offset.alloc.memoryResource = (memory_resource *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_538 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (local_56c != U256) {
      local_568.offset.alloc.memoryResource._0_4_ = local_390._0_4_;
      testing::internal::CmpHelperEQ<pbrt::PixelFormat,pbrt::PixelFormat>
                ((internal *)local_538,"read.image.Format()","format",(PixelFormat *)&local_568,
                 &local_56c);
      if (local_538[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_568);
        pcVar14 = "";
        if ((float *)local_538._8_8_ != (float *)0x0) {
          pcVar14 = *(char **)local_538._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_590,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                   ,0x165,pcVar14);
        testing::internal::AssertHelper::operator=(&local_590,(Message *)&local_568);
        testing::internal::AssertHelper::~AssertHelper(&local_590);
        if ((Tuple2<pbrt::Point2,_int>)local_568.offset.alloc.memoryResource !=
            (Tuple2<pbrt::Point2,_int>)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             ((Tuple2<pbrt::Point2,_int>)local_568.offset.alloc.memoryResource !=
              (Tuple2<pbrt::Point2,_int>)0x0)) {
            (**(code **)(*(long *)local_568.offset.alloc.memoryResource + 8))();
          }
          local_568.offset.alloc.memoryResource = (memory_resource *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_538 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    local_538._0_8_ = local_538 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_538,"R","");
    local_518 = local_508;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_538 + 0x20),"G","");
    local_4f8[0] = local_4e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4f8,"B","");
    requestedChannels.n = 3;
    requestedChannels.ptr = (string *)local_538;
    pbrt::Image::GetChannelDesc(&local_568,(Image *)local_390,requestedChannels);
    lVar11 = -0x60;
    plVar18 = local_4e8;
    do {
      if (plVar18 != (long *)plVar18[-2]) {
        operator_delete((long *)plVar18[-2],*plVar18 + 1);
      }
      plVar18 = plVar18 + -4;
      lVar11 = lVar11 + 0x20;
    } while (lVar11 != 0);
    local_4b8 = local_568.offset.nStored;
    local_590.data_._0_1_ = (internal)(local_568.offset.nStored != 0);
    local_588.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_568.offset.nStored == 0) {
      testing::Message::Message((Message *)&local_598);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_538,(internal *)&local_590,(AssertionResult *)"bool(rgbDesc)",
                 "false","true",(char *)encoding);
      testing::internal::AssertHelper::AssertHelper
                (&local_578,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x168,(char *)local_538._0_8_);
      testing::internal::AssertHelper::operator=(&local_578,(Message *)&local_598);
      testing::internal::AssertHelper::~AssertHelper(&local_578);
      if ((AssertHelperData *)local_538._0_8_ != (AssertHelperData *)(local_538 + 0x10)) {
        operator_delete((void *)local_538._0_8_,local_528._M_allocated_capacity + 1);
      }
      if (local_598.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_598.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_598.data_ + 8))();
        }
        local_598.data_ = (AssertHelperData *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_588,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_568.offset.nStored = 0;
      (**(code **)(*(long *)local_568.offset.alloc.memoryResource + 0x18))
                (local_568.offset.alloc.memoryResource,local_568.offset.ptr,
                 local_568.offset.nAlloc << 2,4);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_278.stringVectors._M_t);
      if (local_278.colorSpace.set == true) {
        local_278.colorSpace.set = false;
      }
      if (local_278.MSE.set == true) {
        local_278.MSE.set = false;
      }
      if (local_278.samplesPerPixel.set == true) {
        local_278.samplesPerPixel.set = false;
      }
      if (local_278.fullResolution.set == true) {
        local_278.fullResolution.set = false;
      }
      if (local_278.pixelBounds.set == true) {
        local_278.pixelBounds.set = false;
      }
      if (local_278.NDCFromWorld.set == true) {
        local_278.NDCFromWorld.set = false;
      }
      if (local_278.cameraFromWorld.set == true) {
        local_278.cameraFromWorld.set = false;
      }
      if (local_278.renderTimeSeconds.set == true) {
        local_278.renderTimeSeconds.set = false;
      }
      local_280 = 0;
      (*(local_298.memoryResource)->_vptr_memory_resource[3])
                (local_298.memoryResource,local_290,local_288 << 2,4);
      local_2a0 = 0;
      (*(local_2b8.memoryResource)->_vptr_memory_resource[3])
                (local_2b8.memoryResource,local_2b0,local_2a8 * 2,2);
      local_2c0 = 0;
      (*(local_2d8.memoryResource)->_vptr_memory_resource[3])
                (local_2d8.memoryResource,local_2d0,local_2c8,1);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_380);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_490.stringVectors._M_t);
      if (local_490.colorSpace.set == true) {
        local_490.colorSpace.set = false;
      }
      if (local_490.MSE.set == true) {
        local_490.MSE.set = false;
      }
      if (local_490.samplesPerPixel.set == true) {
        local_490.samplesPerPixel.set = false;
      }
      if (local_490.fullResolution.set == true) {
        local_490.fullResolution.set = false;
      }
      if (local_490.pixelBounds.set == true) {
        local_490.pixelBounds.set = false;
      }
      if (local_490.NDCFromWorld.set == true) {
        local_490.NDCFromWorld.set = false;
      }
      if (local_490.cameraFromWorld.set == true) {
        local_490.cameraFromWorld.set = false;
      }
      if (local_490.renderTimeSeconds.set == true) {
        local_490.renderTimeSeconds.set = false;
      }
      local_148.p32.nStored = 0;
      (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
      local_148.p16.nStored = 0;
      (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
      local_148.p8.nStored = 0;
      (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
LAB_002cea2c:
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector(&local_148.channelNames);
LAB_002cea39:
      local_4b0.nStored = 0;
      (*(local_4b0.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_4b0.alloc.memoryResource,local_4b0.ptr,local_4b0.nAlloc << 2,4);
      return;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_588,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar7 = 0;
    do {
      local_4c8 = uVar7 << 0x20;
      uVar13 = 0;
      local_4c0 = uVar7;
      do {
        PVar16.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_4c8 | uVar13);
        pbrt::Image::GetChannels
                  ((ImageChannelValues *)local_538,(Image *)local_390,PVar16,&local_568,
                   (WrapMode2D)0x200000002);
        lVar11 = 0;
        lVar12 = 0;
        do {
          iVar17 = (int)lVar12;
          if (local_56c == Half) {
            auVar24._0_4_ =
                 pbrt::Image::GetChannel(&local_148,PVar16,iVar17,(WrapMode2D)0x200000002);
            auVar24._4_60_ = extraout_var_00;
            auVar2._8_4_ = 0x7fffffff;
            auVar2._0_8_ = 0x7fffffff7fffffff;
            auVar2._12_4_ = 0x7fffffff;
            auVar20 = vpandd_avx512vl(auVar24._0_16_,auVar2);
            fVar8 = auVar20._0_4_;
            if ((uint)fVar8 < 0x47800000) {
              if ((uint)fVar8 < 0x38800000) {
                fVar8 = fVar8 + 0.5;
              }
              else {
                fVar8 = (float)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >>
                               0xd);
              }
            }
            else {
              fVar8 = (float)((0x7f800000 < (uint)fVar8 | 0x3e) << 9);
            }
            iVar17 = vmovmskps_avx(auVar24._0_16_);
            uVar5 = (uint)(iVar17 << 0x1f) >> 0x10;
            uVar9 = (uVar5 | (uint)fVar8 & 0xffff) << 0xd;
            if (((uint)fVar8 & 0x7c00) == 0x7c00) {
              fVar10 = (float)(uVar9 | 0x70000000);
            }
            else if (((uint)fVar8 & 0x7c00) == 0) {
              fVar10 = (float)(uVar9 | 0x38800000) + -6.1035156e-05;
            }
            else {
              fVar10 = (float)(((uint)fVar8 & 0x7fff) * 0x2000 + 0x38000000);
            }
            local_598.data_._0_4_ = (Float)((uVar5 | (uint)fVar8 & 0x8000) << 0x10 | (uint)fVar10);
            pfVar15 = (float *)local_538._8_8_;
            if ((float *)local_538._8_8_ == (float *)0x0) {
              pfVar15 = (float *)(local_538 + 0x10);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&local_590,"Float(Half(image.GetChannel({x, y}, c)))","v[c]",
                       (float *)&local_598,(float *)((long)pfVar15 + lVar11));
            if (local_590.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_598);
              pcVar14 = "";
              if (local_588.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar14 = ((local_588.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_578,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x171,pcVar14);
              testing::internal::AssertHelper::operator=(&local_578,(Message *)&local_598);
              testing::internal::AssertHelper::~AssertHelper(&local_578);
              if (local_598.data_ != (AssertHelperData *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) && (local_598.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_598.data_ + 8))();
                }
                local_598.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_588,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else if (local_56c == U256) {
            auVar23._0_4_ =
                 pbrt::Image::GetChannel(&local_148,PVar16,iVar17,(WrapMode2D)0x200000002);
            auVar23._4_60_ = extraout_var;
            auVar1._8_4_ = 0x7fffffff;
            auVar1._0_8_ = 0x7fffffff7fffffff;
            auVar1._12_4_ = 0x7fffffff;
            auVar20 = vpandd_avx512vl(auVar23._0_16_,auVar1);
            fVar8 = auVar20._0_4_;
            if ((uint)fVar8 < 0x47800000) {
              if ((uint)fVar8 < 0x38800000) {
                fVar8 = fVar8 + 0.5;
              }
              else {
                fVar8 = (float)((int)fVar8 + 0x8000fff + (uint)(((uint)fVar8 >> 0xd & 1) != 0) >>
                               0xd);
              }
            }
            else {
              fVar8 = (float)((0x7f800000 < (uint)fVar8 | 0x3e) << 9);
            }
            iVar17 = vmovmskps_avx(auVar23._0_16_);
            uVar5 = (uint)(iVar17 << 0x1f) >> 0x10;
            uVar9 = (uVar5 | (uint)fVar8 & 0xffff) << 0xd;
            if (((uint)fVar8 & 0x7c00) == 0x7c00) {
              fVar10 = (float)(uVar9 | 0x70000000);
            }
            else if (((uint)fVar8 & 0x7c00) == 0) {
              fVar10 = (float)(uVar9 | 0x38800000) + -6.1035156e-05;
            }
            else {
              fVar10 = (float)(((uint)fVar8 & 0x7fff) * 0x2000 + 0x38000000);
            }
            local_598.data_._0_4_ = (Float)((uVar5 | (uint)fVar8 & 0x8000) << 0x10 | (uint)fVar10);
            pfVar15 = (float *)local_538._8_8_;
            if ((float *)local_538._8_8_ == (float *)0x0) {
              pfVar15 = (float *)(local_538 + 0x10);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&local_590,"Float(Half(image.GetChannel({x, y}, c)))","v[c]",
                       (float *)&local_598,(float *)((long)pfVar15 + lVar11));
            if (local_590.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_598);
              pcVar14 = "";
              if (local_588.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar14 = ((local_588.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_578,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x16f,pcVar14);
              testing::internal::AssertHelper::operator=(&local_578,(Message *)&local_598);
              testing::internal::AssertHelper::~AssertHelper(&local_578);
              if (local_598.data_ != (AssertHelperData *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) && (local_598.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_598.data_ + 8))();
                }
                local_598.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_588,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            FVar22 = pbrt::Image::GetChannel(&local_148,PVar16,iVar17,(WrapMode2D)0x200000002);
            local_598.data_._0_4_ = FVar22;
            pfVar15 = (float *)local_538._8_8_;
            if ((float *)local_538._8_8_ == (float *)0x0) {
              pfVar15 = (float *)(local_538 + 0x10);
            }
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&local_590,"image.GetChannel({x, y}, c)","v[c]",
                       (float *)&local_598,(float *)((long)pfVar15 + lVar11));
            if (local_590.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&local_598);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_598.data_)->line," @ (",4);
              std::ostream::operator<<((ostream *)&(local_598.data_)->line,(int)uVar13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_598.data_)->line,", ",2);
              std::ostream::operator<<((ostream *)&(local_598.data_)->line,(int)local_4c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_598.data_)->line,", ch ",5);
              std::ostream::operator<<((ostream *)&(local_598.data_)->line,iVar17);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_598.data_)->line,")",1);
              pcVar14 = "";
              if (local_588.ptr_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar14 = ((local_588.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_578,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0x173,pcVar14);
              testing::internal::AssertHelper::operator=(&local_578,(Message *)&local_598);
              testing::internal::AssertHelper::~AssertHelper(&local_578);
              if (local_598.data_ != (AssertHelperData *)0x0) {
                bVar3 = testing::internal::IsTrue(true);
                if ((bVar3) && (local_598.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_598.data_ + 8))();
                }
                local_598.data_ = (AssertHelperData *)0x0;
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_588,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          lVar12 = lVar12 + 1;
          lVar11 = lVar11 + 4;
        } while (lVar12 != 3);
        local_510 = 0;
        (**(code **)(*(long *)local_538._0_8_ + 0x18))
                  (local_538._0_8_,local_538._8_8_,(long)local_518 << 2,4);
        uVar13 = uVar13 + 1;
      } while (uVar13 != 0x10);
      uVar7 = local_4c0 + 1;
    } while (uVar7 != 0x31);
    local_590.data_ = local_590.data_ & 0xffffffff00000000;
    iVar17 = remove("test.exr");
    local_598.data_._0_4_ = (Float)iVar17;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_538,"0","remove(\"test.exr\")",(int *)&local_590,(int *)&local_598)
    ;
    if (local_538[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_590);
      pcVar14 = "";
      if ((float *)local_538._8_8_ != (float *)0x0) {
        pcVar14 = *(char **)local_538._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_598,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                 ,0x177,pcVar14);
      testing::internal::AssertHelper::operator=(&local_598,(Message *)&local_590);
      testing::internal::AssertHelper::~AssertHelper(&local_598);
      if (local_590.data_ != (AssertHelperData *)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (local_590.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_590.data_ + 8))();
        }
        local_590.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_538 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_568.offset.nStored = 0;
    (**(code **)(*(long *)local_568.offset.alloc.memoryResource + 0x18))
              (local_568.offset.alloc.memoryResource,local_568.offset.ptr,
               local_568.offset.nAlloc << 2,4);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_278.stringVectors._M_t);
    if (local_278.colorSpace.set == true) {
      local_278.colorSpace.set = false;
    }
    if (local_278.MSE.set == true) {
      local_278.MSE.set = false;
    }
    if (local_278.samplesPerPixel.set == true) {
      local_278.samplesPerPixel.set = false;
    }
    if (local_278.fullResolution.set == true) {
      local_278.fullResolution.set = false;
    }
    if (local_278.pixelBounds.set == true) {
      local_278.pixelBounds.set = false;
    }
    if (local_278.NDCFromWorld.set == true) {
      local_278.NDCFromWorld.set = false;
    }
    if (local_278.cameraFromWorld.set == true) {
      local_278.cameraFromWorld.set = false;
    }
    if (local_278.renderTimeSeconds.set == true) {
      local_278.renderTimeSeconds.set = false;
    }
    local_280 = 0;
    (*(local_298.memoryResource)->_vptr_memory_resource[3])
              (local_298.memoryResource,local_290,local_288 << 2,4);
    local_2a0 = 0;
    (*(local_2b8.memoryResource)->_vptr_memory_resource[3])
              (local_2b8.memoryResource,local_2b0,local_2a8 * 2,2);
    local_2c0 = 0;
    (*(local_2d8.memoryResource)->_vptr_memory_resource[3])
              (local_2d8.memoryResource,local_2d0,local_2c8,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_380);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_490.stringVectors._M_t);
    if (local_490.colorSpace.set == true) {
      local_490.colorSpace.set = false;
    }
    if (local_490.MSE.set == true) {
      local_490.MSE.set = false;
    }
    if (local_490.samplesPerPixel.set == true) {
      local_490.samplesPerPixel.set = false;
    }
    if (local_490.fullResolution.set == true) {
      local_490.fullResolution.set = false;
    }
    if (local_490.pixelBounds.set == true) {
      local_490.pixelBounds.set = false;
    }
    if (local_490.NDCFromWorld.set == true) {
      local_490.NDCFromWorld.set = false;
    }
    if (local_490.cameraFromWorld.set == true) {
      local_490.cameraFromWorld.set = false;
    }
    if (local_490.renderTimeSeconds.set == true) {
      local_490.renderTimeSeconds.set = false;
    }
    local_148.p32.nStored = 0;
    (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
    local_148.p16.nStored = 0;
    (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
    local_148.p8.nStored = 0;
    (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_148.channelNames);
    if ((local_4b8 == 0) || (lVar11 = local_178 + 4, lVar11 == 0xc)) goto LAB_002cea39;
  } while( true );
}

Assistant:

TEST(Image, ExrIO) {
    Point2i res(16, 49);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        Image image(format, res, {"R", "G", "B"}, ColorEncodingHandle::Linear);
        image.CopyRectIn({{0, 0}, res}, rgbPixels);

        // Check CopyRectIn()
        int offset = 0;
        for (int y = 0; y < res.y; ++y)
            for (int x = 0; x < res.x; ++x)
                for (int c = 0; c < 3; ++c, ++offset) {
                    if (format == PixelFormat::U256)
                        ;
                    else if (format == PixelFormat::Half)
                        ASSERT_EQ(Float(Half(rgbPixels[offset])),
                                  image.GetChannel({x, y}, c));
                    else if (format == PixelFormat::Float)
                        ASSERT_EQ(rgbPixels[offset], image.GetChannel({x, y}, c));
                }

        ImageMetadata metadata;
        metadata.colorSpace = RGBColorSpace::ACES2065_1;
        EXPECT_TRUE(image.Write("test.exr", metadata));

        ImageAndMetadata read = Image::Read("test.exr");

        EXPECT_EQ(image.Resolution(), read.image.Resolution());
        EXPECT_EQ(*RGBColorSpace::ACES2065_1, *read.metadata.GetColorSpace());
        if (!Is8Bit(format))
            EXPECT_EQ(read.image.Format(), format);

        ImageChannelDesc rgbDesc = read.image.GetChannelDesc({"R", "G", "B"});
        ASSERT_TRUE(bool(rgbDesc));

        for (int y = 0; y < res[1]; ++y)
            for (int x = 0; x < res[0]; ++x) {
                ImageChannelValues v = read.image.GetChannels({x, y}, rgbDesc);
                for (int c = 0; c < 3; ++c)
                    if (Is8Bit(format))
                        EXPECT_EQ(Float(Half(image.GetChannel({x, y}, c))), v[c]);
                    else if (Is16Bit(format))
                        EXPECT_EQ(Float(Half(image.GetChannel({x, y}, c))), v[c]);
                    else
                        EXPECT_EQ(image.GetChannel({x, y}, c), v[c])
                            << " @ (" << x << ", " << y << ", ch " << c << ")";
            }

        EXPECT_EQ(0, remove("test.exr"));
    }
}